

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum
pbrt::ConnectBDPT(Integrator *integrator,SampledWavelengths *lambda,Vertex *lightVertices,
                 Vertex *cameraVertices,int s,int t,LightSamplerHandle *lightSampler,
                 CameraHandle *camera,SamplerHandle *sampler,optional<pbrt::Point2<float>_> *pRaster
                 ,Float *misWeightPtr)

{
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  this;
  BSDF *pBVar1;
  Vertex *pVVar2;
  undefined4 uVar3;
  Interval IVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)> aVar14;
  Vertex *pVVar15;
  Point3fi *pPVar16;
  bool bVar17;
  int iVar18;
  BxDFFlags BVar19;
  SurfaceInteraction *this_00;
  Normal3f *pNVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  DebugMLTSampler *pDVar24;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  sampler_00;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  Vertex *pVVar28;
  long in_FS_OFFSET;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Float FVar32;
  undefined4 uVar33;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar34;
  undefined8 uVar35;
  Tuple2<pbrt::Point2,_float> u;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar58 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar44 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar55 [64];
  undefined1 extraout_var_09 [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined8 uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar70 [56];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM2 [64];
  Point3f PVar73;
  SampledSpectrum SVar74;
  optional<pbrt::SampledLight> sampledLight;
  RNG rng;
  optional<pbrt::LightLiSample> lightWeight;
  optional<pbrt::CameraWiSample> cs;
  float local_498;
  float afStack_494 [3];
  SampledWavelengths *local_488;
  float local_480;
  DispatchSplit<9> local_479;
  undefined1 local_478 [16];
  ulong local_468;
  Integrator *local_458;
  Vertex *local_450;
  undefined8 local_448;
  float local_440;
  float local_43c;
  Float local_438;
  Float FStack_434;
  Float FStack_430;
  Float FStack_42c;
  undefined1 local_428 [16];
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_418;
  Vertex *local_410;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 auStack_3f8 [16];
  undefined1 local_3e8 [16];
  Vertex *local_3d8;
  undefined4 local_3cc;
  undefined1 local_3c8 [8];
  undefined8 uStack_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  float fStack_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined4 uStack_388;
  MediumInterface *pMStack_384;
  float local_378;
  float fStack_374;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  Interaction IStack_358;
  uint local_308;
  undefined8 uStack_2f4;
  undefined8 uStack_2ec;
  undefined8 uStack_2e4;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined1 local_2b8 [8];
  long lStack_2b0;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  Interaction IStack_290;
  Interaction local_240;
  bool local_1f0;
  Float local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_1d0;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_1c8;
  undefined8 local_1c0;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_1b8;
  Vertex local_1b0;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar45 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 auVar66 [64];
  
  auVar29 = in_ZMM2._0_16_;
  uVar59 = 0;
  local_498 = 0.0;
  afStack_494[0] = 0.0;
  afStack_494[1] = 0.0;
  afStack_494[2] = 0.0;
  if ((s != 0 && 1 < t) && (cameraVertices[(ulong)(uint)t - 1].type == Light)) {
    uVar35 = 0;
    goto LAB_003e52c4;
  }
  local_1b0.beta.values.values = (array<float,_4>)ZEXT816(0);
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = 0.0;
  local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = 0.0;
  local_1b0.field_2.ei.super_Interaction.time = 0.0;
  local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_1b0.field_2._60_4_ = 0;
  local_1b0.field_2.ei.super_Interaction.mediumInterface = (MediumInterface *)0x0;
  local_1b0.field_2.ei.super_Interaction.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (MediumHandle)
          (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0x0;
  local_1b0.field_2.ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)0x0;
  local_1b0.bsdf.bxdf.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits._0_4_ = 0;
  local_1b0.bsdf.bxdf.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits._4_4_ = 0;
  local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
  local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
  local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  local_1b0.delta = false;
  local_1b0.pdfFwd = 0.0;
  local_1b0.pdfRev = 0.0;
  local_488 = lambda;
  local_458 = integrator;
  local_450 = cameraVertices;
  local_410 = lightVertices;
  if (s == 0) {
    if ((cameraVertices[(long)t + -1].type != Light) &&
       ((local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_),
        uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0),
        uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8),
        uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0),
        cameraVertices[(long)t + -1].type != Surface ||
        (local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_),
        uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0),
        uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8),
        uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0),
        (cameraVertices[(long)t + -1].field_2.si.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits & 0xffffffffffff) == 0)))) goto LAB_003e5168;
    auVar58 = ZEXT856(0);
    auVar70 = ZEXT856(0);
    SVar74 = Vertex::Le(cameraVertices + (long)t + -1,&integrator->infiniteLights,
                        cameraVertices + (long)t + -2,lambda);
    auVar62._0_8_ = SVar74.values.values._8_8_;
    auVar62._8_56_ = auVar70;
    auVar38._0_8_ = SVar74.values.values._0_8_;
    auVar38._8_56_ = auVar58;
    auVar29 = vmovlhps_avx(auVar38._0_16_,auVar62._0_16_);
    local_498 = auVar29._0_4_ * cameraVertices[(long)t + -1].beta.values.values[0];
    afStack_494[0] = auVar29._4_4_ * cameraVertices[(long)t + -1].beta.values.values[1];
    afStack_494[1] = auVar29._8_4_ * cameraVertices[(long)t + -1].beta.values.values[2];
    afStack_494[2] = auVar29._12_4_ * cameraVertices[(long)t + -1].beta.values.values[3];
LAB_003e4314:
    local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_);
    uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0);
    uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
    uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
  }
  else if (t == 1) {
    pVVar2 = lightVertices + (long)s + -1;
    bVar17 = Vertex::IsConnectible(pVVar2);
    pVVar28 = local_410;
    local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_);
    uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0);
    uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
    uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
    if (!bVar17) goto LAB_003e5168;
    pVVar15 = local_410 + (long)s + -1;
    uVar22 = (sampler->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
    pDVar24 = (DebugMLTSampler *)(uVar22 & 0xffffffffffff);
    uVar10 = (ushort)(uVar22 >> 0x30);
    if (uVar22 >> 0x30 < 5) {
      if (uVar10 < 3) {
        if (uVar10 == 2) {
          u = (Tuple2<pbrt::Point2,_float>)StratifiedSampler::Get2D((StratifiedSampler *)pDVar24);
        }
        else {
          u = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)pDVar24);
        }
      }
      else if (uVar10 == 3) {
        u = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)pDVar24);
      }
      else {
        u = (Tuple2<pbrt::Point2,_float>)PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar24);
      }
    }
    else if (uVar10 < 7) {
      if (uVar10 == 6) {
        u = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)pDVar24);
      }
      else {
        u = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)pDVar24);
      }
    }
    else if (uVar22 >> 0x30 == 8) {
      u = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar24);
    }
    else if (uVar10 == 7) {
      u = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar24);
    }
    else {
      local_408._0_4_ = DebugMLTSampler::Get1D(pDVar24);
      local_408._4_4_ = extraout_XMM0_Db;
      fStack_400 = (float)extraout_XMM0_Dc;
      fStack_3fc = (float)extraout_XMM0_Dd;
      auVar44._0_4_ = DebugMLTSampler::Get1D(pDVar24);
      auVar44._4_60_ = extraout_var;
      auVar29 = vinsertps_avx(_local_408,auVar44._0_16_,0x10);
      u = auVar29._0_8_;
    }
    CameraHandle::SampleWi
              ((optional<pbrt::CameraWiSample> *)local_2b8,camera,
               &(pVVar15->field_2).ei.super_Interaction,(Point2f)u,local_488);
    if (local_1f0 == true) {
      if (pRaster->set == true) {
        pRaster->set = false;
      }
      aVar14._4_4_ = uStack_294;
      aVar14.__align = (anon_struct_4_0_00000001_for___align)uStack_298;
      pRaster->optionalValue = aVar14;
      pRaster->set = true;
      local_1b0.field_2.ei.field_0 =
           (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)
           (camera->
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           ).bits;
      auVar6._4_4_ = uStack_29c;
      auVar6._0_4_ = uStack_29c;
      auVar6._8_4_ = uStack_29c;
      auVar6._12_4_ = uStack_29c;
      local_1b0.beta.values.values = (array<float,_4>)vdivps_avx512vl(_local_2b8,auVar6);
      local_3c8._4_4_ =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           low;
      uStack_3c0._0_4_ =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           high;
      uStack_3c0._4_4_ =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           low;
      uStack_3b8._0_4_ =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           high;
      uStack_3b8._4_4_ =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           low;
      uStack_3b0._0_4_ =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           high;
      uStack_3b0._4_4_ = local_240.time;
      fStack_3a8 = local_240.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_3a4 = local_240.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      fStack_3a0 = local_240.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      fStack_39c = local_240.n.super_Tuple3<pbrt::Normal3,_float>.x;
      fStack_398 = local_240.n.super_Tuple3<pbrt::Normal3,_float>.y;
      fStack_394 = local_240.n.super_Tuple3<pbrt::Normal3,_float>.z;
      fStack_390 = local_240.uv.super_Tuple2<pbrt::Point2,_float>.x;
      fStack_38c = local_240.uv.super_Tuple2<pbrt::Point2,_float>.y;
      uStack_388 = local_240._60_4_;
      pMStack_384 = local_240.mediumInterface;
      uStack_2d8 = 0;
      uStack_2d4 = 0;
      uStack_2d0 = 0;
      uStack_2cc = 0;
      uStack_2c8 = 0;
      local_1b0.type = Camera;
      local_1b0._20_4_ = local_3c8._0_4_;
      local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           low;
      local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           high;
      local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           low;
      local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           high;
      local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           low;
      local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high =
           local_240.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           high;
      local_1b0.field_2.ei.super_Interaction.time = local_240.time;
      local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
           local_240.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
           local_240.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
           local_240.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
           local_240.n.super_Tuple3<pbrt::Normal3,_float>.x;
      local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
           local_240.n.super_Tuple3<pbrt::Normal3,_float>.y;
      local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
           local_240.n.super_Tuple3<pbrt::Normal3,_float>.z;
      local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
           local_240.uv.super_Tuple2<pbrt::Point2,_float>.x;
      local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
           local_240.uv.super_Tuple2<pbrt::Point2,_float>.y;
      local_1b0.field_2._60_4_ = local_240._60_4_;
      local_1b0.field_2.ei.super_Interaction.mediumInterface = local_240.mediumInterface;
      local_1b0.field_2.ei.super_Interaction.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (MediumHandle)
              (MediumHandle)
              local_240.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      local_1b0.field_2._220_8_ = uStack_2f4;
      local_1b0.field_2._228_8_ = uStack_2ec;
      local_1b0.field_2._236_8_ = uStack_2e4;
      local_1b0.bsdf.bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
      .bits._0_4_ = 0;
      local_1b0.bsdf.bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
      .bits._4_4_ = 0;
      local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      local_1b0.field_2._92_4_ = fStack_374;
      local_1b0.field_2._88_4_ = local_378;
      local_1b0.field_2._96_8_ = uStack_370;
      local_1b0.field_2._104_8_ = uStack_368;
      local_1b0.field_2._112_8_ = uStack_360;
      local_1b0.field_2.mi.sigma_maj.values.values[0] =
           IStack_358.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           low;
      local_1b0.field_2.mi.sigma_maj.values.values[1] =
           IStack_358.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
           high;
      local_1b0.field_2.mi.sigma_maj.values.values[2] =
           IStack_358.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           low;
      local_1b0.field_2.mi.sigma_maj.values.values[3] =
           IStack_358.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
           high;
      local_1b0.field_2.mi.Le.values.values[0] =
           IStack_358.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           low;
      local_1b0.field_2.mi.Le.values.values[1] =
           IStack_358.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
           high;
      local_1b0.field_2.mi.Le.values.values[2] = IStack_358.time;
      local_1b0.field_2.mi.Le.values.values[3] = IStack_358.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
           IStack_358.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
           IStack_358.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
           IStack_358.n.super_Tuple3<pbrt::Normal3,_float>.x;
      local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
           IStack_358.n.super_Tuple3<pbrt::Normal3,_float>.y;
      local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
           IStack_358.n.super_Tuple3<pbrt::Normal3,_float>.z;
      local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
           IStack_358.uv.super_Tuple2<pbrt::Point2,_float>.x;
      local_1b0.field_2._176_8_ = IStack_358._56_8_;
      local_1b0.field_2._184_8_ = IStack_358.mediumInterface;
      local_1b0.field_2.si.material.
      super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      .bits = (MaterialHandle)
              (MaterialHandle)
              IStack_358.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
      local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
      local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
      local_1b0.delta = false;
      local_1b0.pdfFwd = 0.0;
      local_1b0.pdfRev = 0.0;
      auVar58 = ZEXT856(0);
      auVar70 = ZEXT856((ulong)IStack_358.n.super_Tuple3<pbrt::Normal3,_float>._0_8_);
      SVar74 = Vertex::f(pVVar2,&local_1b0,Importance);
      auVar66._0_8_ = SVar74.values.values._8_8_;
      auVar66._8_56_ = auVar70;
      auVar45._0_8_ = SVar74.values.values._0_8_;
      auVar45._8_56_ = auVar58;
      auVar29 = vmovlhps_avx(auVar45._0_16_,auVar66._0_16_);
      local_498 = auVar29._0_4_ * pVVar28[(long)s + -1].beta.values.values[0] *
                  local_1b0.beta.values.values[0];
      afStack_494[0] =
           auVar29._4_4_ * pVVar28[(long)s + -1].beta.values.values[1] *
           local_1b0.beta.values.values[1];
      afStack_494[1] =
           auVar29._8_4_ * pVVar28[(long)s + -1].beta.values.values[2] *
           local_1b0.beta.values.values[2];
      afStack_494[2] =
           auVar29._12_4_ * pVVar28[(long)s + -1].beta.values.values[3] *
           local_1b0.beta.values.values[3];
      if ((((pVVar28[(long)s + -1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>
             .x != 0.0) ||
           (fVar34 = pVVar28[(long)s + -1].field_2.ei.super_Interaction.n.
                     super_Tuple3<pbrt::Normal3,_float>.y, fVar34 != 0.0)) || (NAN(fVar34))) ||
         ((fVar34 = pVVar28[(long)s + -1].field_2.ei.super_Interaction.n.
                    super_Tuple3<pbrt::Normal3,_float>.z, fVar34 != 0.0 || (NAN(fVar34))))) {
        if (local_1f0 == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
        }
        pNVar20 = &(pVVar2->field_2).ei.super_Interaction.n;
        if (pVVar2->type == Surface) {
          pNVar20 = (Normal3f *)((pVVar2->field_2).mi.sigma_maj.values.values + 2);
        }
        fVar34 = (pNVar20->super_Tuple3<pbrt::Normal3,_float>).z;
        auVar30 = ZEXT416((uint)(fVar34 * (float)uStack_2a0));
        auVar29 = vfmadd132ss_fma(ZEXT416((uint)(pNVar20->super_Tuple3<pbrt::Normal3,_float>).y),
                                  auVar30,ZEXT416((uint)uStack_2a4));
        auVar30 = vfmsub213ss_fma(ZEXT416((uint)uStack_2a0),ZEXT416((uint)fVar34),auVar30);
        auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                  ZEXT416((uint)(pNVar20->super_Tuple3<pbrt::Normal3,_float>).x),
                                  ZEXT416((uint)uStack_2a8));
        uVar33 = auVar29._0_4_;
        auVar36._4_4_ = uVar33;
        auVar36._0_4_ = uVar33;
        auVar36._8_4_ = uVar33;
        auVar36._12_4_ = uVar33;
        auVar7._8_4_ = 0x7fffffff;
        auVar7._0_8_ = 0x7fffffff7fffffff;
        auVar7._12_4_ = 0x7fffffff;
        auVar29 = vandps_avx512vl(auVar36,auVar7);
        local_498 = auVar29._0_4_ * local_498;
        afStack_494[0] = auVar29._4_4_ * afStack_494[0];
        afStack_494[1] = auVar29._8_4_ * afStack_494[1];
        afStack_494[2] = auVar29._12_4_ * afStack_494[2];
      }
      if ((local_498 == 0.0) && (!NAN(local_498))) {
        uVar22 = 0;
        while (uVar25 = uVar22, uVar25 != 3) {
          if ((afStack_494[uVar25] != 0.0) || (uVar22 = uVar25 + 1, NAN(afStack_494[uVar25])))
          break;
        }
        if (2 < uVar25) goto LAB_003e4aec;
      }
      if (local_1f0 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
      }
      uVar22 = CONCAT44(uStack_294,uStack_298) * -0x395b586ca42e166b;
      uVar22 = ((uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) *
               -0x395b586ca42e166b;
      uVar22 = (uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b;
      IStack_358.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_ = local_240.mediumInterface;
      IStack_358.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ =
           local_240.medium.
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           .bits;
      uVar25 = 0x13745e0cb198fe90;
      lVar26 = 0;
      do {
        uVar27 = *(long *)((long)&local_378 + lVar26) * -0x395b586ca42e166b;
        lVar26 = lVar26 + 8;
        uVar25 = (uVar25 ^ (uVar27 >> 0x2f ^ uVar27) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      } while (lVar26 != 0x50);
      uVar22 = uVar22 >> 0x2f ^ uVar22;
      uVar25 = (uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b;
      uStack_3c0 = (undefined8 *)(uVar22 * 2 + 1);
      local_3c8 = (undefined1  [8])
                  (((uVar25 >> 0x2f ^ uVar25) + 1) * 0x5851f42d4c957f2d +
                   uVar22 * -0x4f5c17a566d501a4 + 1);
      auVar58 = ZEXT856(CONCAT44(local_240.pi.super_Point3<pbrt::Interval>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high,
                                 local_240.pi.super_Point3<pbrt::Interval>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low));
      auVar70 = ZEXT856(0);
      SVar74 = Integrator::Tr(local_458,&IStack_290,&local_240,local_488,(RNG *)local_3c8);
      auVar67._0_8_ = SVar74.values.values._8_8_;
      auVar67._8_56_ = auVar70;
      auVar46._0_8_ = SVar74.values.values._0_8_;
      auVar46._8_56_ = auVar58;
      auVar29 = vmovlhps_avx(auVar46._0_16_,auVar67._0_16_);
      local_498 = auVar29._0_4_ * local_498;
      afStack_494[0] = auVar29._4_4_ * afStack_494[0];
      afStack_494[1] = auVar29._8_4_ * afStack_494[1];
      afStack_494[2] = auVar29._12_4_ * afStack_494[2];
    }
LAB_003e4aec:
    uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
    uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
    if (local_1f0 == true) {
      local_1f0 = false;
      uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
      uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
    }
  }
  else if (s == 1) {
    pVVar2 = cameraVertices + (long)t + -1;
    bVar17 = Vertex::IsConnectible(pVVar2);
    local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_);
    uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0);
    uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
    uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
    if (bVar17) {
      local_2b8 = (undefined1  [8])
                  (sampler->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
      FVar32 = DispatchSplit<9>::operator()
                         ((DispatchSplit<9> *)&local_378,local_2b8,(ulong)local_2b8 >> 0x30);
      pVVar28 = local_450;
      uVar22 = (lightSampler->
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               ).bits;
      if ((uVar22 >> 0x30 < 3) && ((short)(uVar22 >> 0x30) == 2)) {
        PowerLightSampler::Sample
                  ((optional<pbrt::SampledLight> *)local_478,
                   (PowerLightSampler *)(uVar22 & 0xffffffffffff),FVar32);
      }
      else {
        lVar26 = *(long *)((uVar22 & 0xffffffffffff) + 0x18);
        if (lVar26 == 0) {
          local_478._0_12_ = ZEXT412(0);
          local_478._12_4_ = 0;
          local_468 = 0;
        }
        else {
          auVar29 = vcvtusi2ss_avx512f(auVar29,lVar26);
          iVar21 = (int)(FVar32 * auVar29._0_4_);
          iVar18 = (int)lVar26 + -1;
          if (iVar21 <= iVar18) {
            iVar18 = iVar21;
          }
          local_468 = CONCAT71(local_468._1_7_,1);
          local_478._8_4_ = 1.0 / auVar29._0_4_;
          local_478._0_8_ =
               *(undefined8 *)(*(long *)((uVar22 & 0xffffffffffff) + 8) + (long)iVar18 * 8);
        }
      }
      if (local_468._0_1_ == true) {
        local_418 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)local_478._0_8_;
        local_43c = (float)local_478._8_4_;
        local_448 = 0;
        local_440 = 0.0;
        local_3d8 = pVVar2;
        if ((((pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
               super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
             (fVar34 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                       super_Tuple3<pbrt::Normal3,_float>.y, fVar34 != 0.0)) || (NAN(fVar34))) ||
           ((fVar34 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                      super_Tuple3<pbrt::Normal3,_float>.z, fVar34 != 0.0 || (NAN(fVar34))))) {
          this_00 = Interaction::AsSurface(&pVVar28[(long)t + -1].field_2.ei.super_Interaction);
          _local_408 = ZEXT832((ulong)(this_00->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
          pPVar16 = &(this_00->super_Interaction).pi;
          local_428._8_8_ = 0;
          local_428._0_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low;
          local_428._4_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               high;
          IVar4 = (this_00->super_Interaction).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          local_438 = IVar4.low;
          FStack_434 = IVar4.high;
          FStack_430 = 0.0;
          FStack_42c = 0.0;
          uVar3 = (this_00->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar5 = (this_00->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_3e8._4_4_ = uVar5;
          local_3e8._0_4_ = uVar3;
          local_3e8._8_8_ = 0;
          local_480 = (this_00->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_440 = (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_448._0_4_ = (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_448._4_4_ = (this_00->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
          pBVar1 = &pVVar28[(long)t + -1].bsdf;
          auVar58 = ZEXT856(0);
          BVar19 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                   ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                               *)pBVar1);
          if (((BVar19 & Reflection) == Unset) ||
             (BVar19 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                       ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                                   *)pBVar1), (BVar19 & Transmission) != Unset)) {
            BVar19 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                     ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                               ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                                 *)pBVar1);
            if (((BVar19 & Transmission) == Unset) ||
               (BVar19 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                         ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                                   ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                                     *)pBVar1), (BVar19 & Reflection) != Unset)) goto LAB_003e4b66;
            uVar22._0_4_ = (this_00->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
            uVar22._4_4_ = (this_00->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar29._0_8_ = uVar22 ^ 0x8000000080000000;
            auVar29._8_4_ = 0x80000000;
            auVar29._12_4_ = 0x80000000;
            auVar58 = ZEXT856(auVar29._8_8_);
            uVar59 = vmovlps_avx(auVar29);
            lStack_2b0._0_4_ = -(this_00->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z
            ;
            local_2b8 = (undefined1  [8])uVar59;
            PVar73 = Interaction::OffsetRayOrigin(&this_00->super_Interaction,(Vector3f *)local_2b8)
            ;
            local_438 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
            auVar43._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar43._8_56_ = auVar58;
            auVar29 = auVar43._0_16_;
          }
          else {
            PVar73 = Interaction::OffsetRayOrigin
                               (&this_00->super_Interaction,&(this_00->super_Interaction).wo);
            local_438 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
            auVar42._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar42._8_56_ = auVar58;
            auVar29 = auVar42._0_16_;
          }
          uVar33 = auVar29._0_4_;
          _local_408 = ZEXT1632(CONCAT412(uVar33,CONCAT48(uVar33,CONCAT44(uVar33,uVar33))));
          local_428 = vmovshdup_avx(auVar29);
          FStack_434 = local_438;
          FStack_430 = local_438;
          FStack_42c = local_438;
        }
        else {
          _local_408 = ZEXT832((ulong)pVVar28[(long)t + -1].field_2.ei.super_Interaction.pi.
                                      super_Point3<pbrt::Interval>.
                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
          pPVar16 = &pVVar28[(long)t + -1].field_2.ei.super_Interaction.pi;
          local_428._8_8_ = 0;
          local_428._0_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low;
          local_428._4_4_ =
               (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               high;
          IVar4 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>
                  .super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          local_438 = IVar4.low;
          FStack_434 = IVar4.high;
          FStack_430 = 0.0;
          FStack_42c = 0.0;
          local_440 = 0.0;
          local_448 = 0;
          local_480 = 0.0;
          local_3e8 = ZEXT816(0) << 0x20;
        }
LAB_003e4b66:
        uVar22 = (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
        pDVar24 = (DebugMLTSampler *)(uVar22 & 0xffffffffffff);
        uVar10 = (ushort)(uVar22 >> 0x30);
        if (uVar22 >> 0x30 < 5) {
          if (uVar22 < 0x3000000000000) {
            if (uVar10 == 2) {
              auVar47._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar24);
              auVar47._8_56_ = extraout_var_01;
              auVar29 = auVar47._0_16_;
            }
            else {
              auVar51._0_8_ = RandomSampler::Get2D((RandomSampler *)pDVar24);
              auVar51._8_56_ = extraout_var_05;
              auVar29 = auVar51._0_16_;
            }
          }
          else if (uVar10 == 3) {
            auVar49._0_8_ = HaltonSampler::Get2D((HaltonSampler *)pDVar24);
            auVar49._8_56_ = extraout_var_03;
            auVar29 = auVar49._0_16_;
          }
          else {
            auVar53._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar24);
            auVar53._8_56_ = extraout_var_07;
            auVar29 = auVar53._0_16_;
          }
        }
        else if (uVar10 < 7) {
          if (uVar10 == 6) {
            auVar48._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)pDVar24);
            auVar48._8_56_ = extraout_var_02;
            auVar29 = auVar48._0_16_;
          }
          else {
            auVar52._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar24);
            auVar52._8_56_ = extraout_var_06;
            auVar29 = auVar52._0_16_;
          }
        }
        else if (uVar22 >> 0x30 == 8) {
          auVar54._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar24);
          auVar54._8_56_ = extraout_var_08;
          auVar29 = auVar54._0_16_;
        }
        else if (uVar10 == 7) {
          auVar50._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar24);
          auVar50._8_56_ = extraout_var_04;
          auVar29 = auVar50._0_16_;
        }
        else {
          local_1e8 = DebugMLTSampler::Get1D(pDVar24);
          uStack_1e4 = extraout_XMM0_Db_00;
          uStack_1e0 = extraout_XMM0_Dc_00;
          uStack_1dc = extraout_XMM0_Dd_00;
          auVar55._0_4_ = DebugMLTSampler::Get1D(pDVar24);
          auVar55._4_60_ = extraout_var_00;
          auVar30._4_4_ = uStack_1e4;
          auVar30._0_4_ = local_1e8;
          auVar30._8_4_ = uStack_1e0;
          auVar30._12_4_ = uStack_1dc;
          auVar29 = vinsertps_avx(auVar30,auVar55._0_16_,0x10);
        }
        local_58 = *(undefined8 *)(local_488->lambda).values;
        uStack_50 = *(undefined8 *)((local_488->lambda).values + 2);
        uStack_48 = *(undefined8 *)(local_488->pdf).values;
        uStack_40 = *(undefined8 *)((local_488->pdf).values + 2);
        uStack_3b8 = &local_58;
        auVar61._16_16_ = local_3e8;
        auVar61._0_16_ = auVar29;
        auVar71._16_16_ = local_428;
        auVar71._0_16_ = auVar29;
        auVar61 = vperm2f128_avx(auVar71,auVar61,0x31);
        auVar72._0_16_ = local_408._0_16_;
        auVar72._20_4_ = FStack_434;
        auVar72._16_4_ = local_438;
        auVar72._24_4_ = FStack_430;
        auVar72._28_4_ = FStack_42c;
        _local_2b8 = vunpcklpd_avx(auVar72,auVar61);
        uStack_298 = local_480;
        uStack_294 = (undefined4)local_448;
        IStack_290.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
             = (Float)((ulong)local_448 >> 0x20);
        IStack_290.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
             = local_440;
        uStack_3c0 = &local_1c0;
        local_1c0 = vmovlps_avx(auVar29);
        uStack_3b0 = &local_3cc;
        local_3cc = 1;
        local_3c8 = (undefined1  [8])local_2b8;
        local_1b8 = local_418;
        DispatchSplit<9>::operator()(&local_378,&local_479);
        pVVar2 = local_3d8;
        if ((char)local_308 == '\x01') {
          if ((local_378 == 0.0) && (!NAN(local_378))) {
            uVar22 = 0;
            while (uVar25 = uVar22, uVar25 != 3) {
              if (((&fStack_374)[uVar25] != 0.0) ||
                 (uVar22 = uVar25 + 1, NAN((&fStack_374)[uVar25]))) break;
            }
            if (2 < uVar25) goto LAB_003e514a;
          }
          if (0.0 < uStack_360._4_4_) {
            auVar13._4_4_ = fStack_374;
            auVar13._0_4_ = local_378;
            auVar13._8_8_ = uStack_370;
            fVar34 = uStack_360._4_4_ * local_43c;
            auVar60._4_4_ = fVar34;
            auVar60._0_4_ = fVar34;
            auVar60._8_4_ = fVar34;
            auVar60._12_4_ = fVar34;
            local_1b0.beta.values.values = (array<float,_4>)vdivps_avx(auVar13,auVar60);
            local_3c8._4_4_ =
                 IStack_358.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
            uStack_3c0._0_4_ =
                 IStack_358.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
            uStack_3c0._4_4_ =
                 IStack_358.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            uStack_3b8._0_4_ =
                 IStack_358.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            uStack_3b8._4_4_ =
                 IStack_358.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            uStack_3b0._0_4_ =
                 IStack_358.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            uStack_3b0._4_4_ = IStack_358.time;
            fStack_3a8 = IStack_358.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            fStack_3a4 = IStack_358.wo.super_Tuple3<pbrt::Vector3,_float>.y;
            fStack_3a0 = IStack_358.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            fStack_39c = IStack_358.n.super_Tuple3<pbrt::Normal3,_float>.x;
            fStack_398 = IStack_358.n.super_Tuple3<pbrt::Normal3,_float>.y;
            fStack_394 = IStack_358.n.super_Tuple3<pbrt::Normal3,_float>.z;
            fStack_390 = IStack_358.uv.super_Tuple2<pbrt::Point2,_float>.x;
            fStack_38c = IStack_358.uv.super_Tuple2<pbrt::Point2,_float>.y;
            uStack_388 = IStack_358._60_4_;
            pMStack_384 = IStack_358.mediumInterface;
            local_240.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            local_240.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            local_240.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
            local_240.uv.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            local_240.uv.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            local_1b0.type = Light;
            local_1b0._20_4_ = local_3c8._0_4_;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)local_3c8._4_4_;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uStack_3c0;
            local_1b0.field_2.ei.super_Interaction.mediumInterface = IStack_358.mediumInterface;
            local_1b0.field_2.ei.super_Interaction.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (MediumHandle)
                    (MediumHandle)
                    IStack_358.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
            local_1b0.field_2.ei.field_0 = local_418;
            local_1b0.field_2._220_8_ =
                 CONCAT44(local_240.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low,
                          local_240.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high);
            local_1b0.field_2._228_8_ =
                 CONCAT44(local_240.time,
                          local_240.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high);
            local_1b0.field_2._236_8_ =
                 CONCAT44(local_240.wo.super_Tuple3<pbrt::Vector3,_float>.y,
                          local_240.wo.super_Tuple3<pbrt::Vector3,_float>.x);
            local_1b0.bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
            .bits._0_4_ = 0;
            local_1b0.bsdf.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
            .bits._4_4_ = 0;
            local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            local_1b0.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
            local_1b0.field_2._120_8_ = CONCAT44(uStack_294,uStack_298);
            local_1b0.field_2._128_8_ =
                 CONCAT44(IStack_290.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                          IStack_290.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low);
            local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = IStack_290.time
            ;
            local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
                 IStack_290.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            local_1b0.field_2.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
                 IStack_290.wo.super_Tuple3<pbrt::Vector3,_float>.y;
            local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
                 IStack_290.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
                 IStack_290.n.super_Tuple3<pbrt::Normal3,_float>.x;
            local_1b0.field_2.si.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
                 IStack_290.n.super_Tuple3<pbrt::Normal3,_float>.y;
            local_1b0.field_2.si.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
                 IStack_290.n.super_Tuple3<pbrt::Normal3,_float>.z;
            local_1b0.field_2.si.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
                 IStack_290.uv.super_Tuple2<pbrt::Point2,_float>.x;
            local_1b0.field_2._184_8_ = IStack_290._56_8_;
            local_1b0.field_2.si.material.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits = (MaterialHandle)(MaterialHandle)IStack_290.mediumInterface;
            local_1b0.field_2._88_8_ = local_2b8;
            local_1b0.field_2._96_8_ = lStack_2b0;
            local_1b0.field_2._104_8_ = _uStack_2a8;
            local_1b0.field_2._112_8_ = _uStack_2a0;
            local_1b0.field_2.mi.Le.values.values[0] =
                 IStack_290.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            local_1b0.field_2.mi.Le.values.values[1] =
                 IStack_290.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            local_1b0.field_2.mi.Le.values.values[2] =
                 IStack_290.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            local_1b0.field_2.mi.Le.values.values[3] =
                 IStack_290.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
            local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
            local_1b0.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
            local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
            local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
            local_1b0.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
            local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
            local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
            local_1b0.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
            local_1b0.delta = false;
            local_1b0.pdfFwd = 0.0;
            local_1b0.pdfRev = 0.0;
            local_1c8.bits =
                 (lightSampler->
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 ).bits;
            auVar70 = ZEXT856((ulong)IStack_290.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_);
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = uStack_3c0._4_4_;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)uStack_3b8;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = uStack_3b8._4_4_;
            local_1b0.field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = (Float)uStack_3b0;
            local_1b0.field_2.ei.super_Interaction.time = uStack_3b0._4_4_;
            local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
                 fStack_3a8;
            local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
                 fStack_3a4;
            local_1b0.field_2.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
                 fStack_3a0;
            local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
                 fStack_39c;
            local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
                 fStack_398;
            local_1b0.field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                 fStack_394;
            local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                 fStack_390;
            local_1b0.field_2.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                 fStack_38c;
            local_1b0.field_2._60_4_ = uStack_388;
            FVar32 = Vertex::PDFLightOrigin
                               (&local_1b0,&local_458->infiniteLights,local_3d8,
                                (LightSamplerHandle *)&local_1c8);
            local_1b0.pdfFwd = FVar32;
            auVar58 = extraout_var_09;
            SVar74 = Vertex::f(pVVar2,&local_1b0,Radiance);
            auVar68._0_8_ = SVar74.values.values._8_8_;
            auVar68._8_56_ = auVar70;
            auVar56._0_8_ = SVar74.values.values._0_8_;
            auVar56._8_56_ = auVar58;
            auVar29 = vmovlhps_avx(auVar56._0_16_,auVar68._0_16_);
            local_498 = auVar29._0_4_ * pVVar28[(long)t + -1].beta.values.values[0] *
                        local_1b0.beta.values.values[0];
            afStack_494[0] =
                 auVar29._4_4_ * pVVar28[(long)t + -1].beta.values.values[1] *
                 local_1b0.beta.values.values[1];
            afStack_494[1] =
                 auVar29._8_4_ * pVVar28[(long)t + -1].beta.values.values[2] *
                 local_1b0.beta.values.values[2];
            afStack_494[2] =
                 auVar29._12_4_ * pVVar28[(long)t + -1].beta.values.values[3] *
                 local_1b0.beta.values.values[3];
            if ((((pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                   super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
                 (fVar34 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                           super_Tuple3<pbrt::Normal3,_float>.y, fVar34 != 0.0)) || (NAN(fVar34)))
               || ((fVar34 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                             super_Tuple3<pbrt::Normal3,_float>.z, fVar34 != 0.0 || (NAN(fVar34)))))
            {
              if ((char)local_308 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
              }
              pNVar20 = &(pVVar2->field_2).ei.super_Interaction.n;
              if (pVVar2->type == Surface) {
                pNVar20 = (Normal3f *)((pVVar2->field_2).mi.sigma_maj.values.values + 2);
              }
              fVar34 = (pNVar20->super_Tuple3<pbrt::Normal3,_float>).z;
              auVar30 = ZEXT416((uint)(fVar34 * (float)uStack_360));
              auVar29 = vfmadd132ss_fma(ZEXT416((uint)(pNVar20->super_Tuple3<pbrt::Normal3,_float>).
                                                      y),auVar30,ZEXT416(uStack_368._4_4_));
              auVar30 = vfmsub213ss_fma(ZEXT416((uint)(float)uStack_360),ZEXT416((uint)fVar34),
                                        auVar30);
              auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                        ZEXT416((uint)(pNVar20->super_Tuple3<pbrt::Normal3,_float>).
                                                      x),ZEXT416((uint)uStack_368));
              uVar33 = auVar29._0_4_;
              auVar37._4_4_ = uVar33;
              auVar37._0_4_ = uVar33;
              auVar37._8_4_ = uVar33;
              auVar37._12_4_ = uVar33;
              auVar8._8_4_ = 0x7fffffff;
              auVar8._0_8_ = 0x7fffffff7fffffff;
              auVar8._12_4_ = 0x7fffffff;
              auVar29 = vandps_avx512vl(auVar37,auVar8);
              local_498 = auVar29._0_4_ * local_498;
              afStack_494[0] = auVar29._4_4_ * afStack_494[0];
              afStack_494[1] = auVar29._8_4_ * afStack_494[1];
              afStack_494[2] = auVar29._12_4_ * afStack_494[2];
            }
            if ((local_498 == 0.0) && (!NAN(local_498))) {
              uVar22 = 0;
              while (uVar25 = uVar22, uVar25 != 3) {
                if ((afStack_494[uVar25] != 0.0) || (uVar22 = uVar25 + 1, NAN(afStack_494[uVar25])))
                break;
              }
              if (2 < uVar25) goto LAB_003e514a;
            }
            auVar29 = vhaddps_avx(local_408._0_16_,local_428);
            auVar29 = vshufps_avx(auVar29,auVar29,0xe8);
            auVar9._8_4_ = 0x3f000000;
            auVar9._0_8_ = 0x3f0000003f000000;
            auVar9._12_4_ = 0x3f000000;
            auVar30 = vmulps_avx512vl(auVar29,auVar9);
            auVar12._4_4_ = FStack_434;
            auVar12._0_4_ = local_438;
            auVar12._8_4_ = FStack_430;
            auVar12._12_4_ = FStack_42c;
            auVar29 = vhaddps_avx(auVar12,auVar12);
            uVar22 = auVar30._0_8_ * -0x395b586ca42e166b;
            uVar22 = (CONCAT44((int)(uVar22 >> 0x20),auVar29._0_4_ * 0.5) ^
                     ((uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                     -0x395b586ca42e166b) * -0x395b586ca42e166b;
            uVar22 = (uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b;
            uVar22 = uVar22 >> 0x2f ^ uVar22;
            uVar25 = ((ulong)(uint)local_480 ^
                     (((ulong)(local_3e8._0_8_ * -0x395b586ca42e166b) >> 0x2f ^
                      local_3e8._0_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b ^
                     0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
            uVar25 = (uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b;
            lStack_2b0 = uVar22 * 2 + 1;
            local_2b8 = (undefined1  [8])
                        (((uVar25 >> 0x2f ^ uVar25) + 1) * 0x5851f42d4c957f2d +
                         uVar22 * -0x4f5c17a566d501a4 + 1);
            if ((char)local_308 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
            }
            auVar58 = ZEXT856((ulong)local_3e8._8_8_);
            auVar70 = (undefined1  [56])0x0;
            SVar74 = Integrator::Tr(local_458,&pVVar28[(long)t + -1].field_2.ei.super_Interaction,
                                    &IStack_358,local_488,(RNG *)local_2b8);
            auVar69._0_8_ = SVar74.values.values._8_8_;
            auVar69._8_56_ = auVar70;
            auVar57._0_8_ = SVar74.values.values._0_8_;
            auVar57._8_56_ = auVar58;
            auVar29 = vpunpcklqdq_avx(auVar57._0_16_,auVar69._0_16_);
            local_498 = auVar29._0_4_ * local_498;
            afStack_494[0] = auVar29._4_4_ * afStack_494[0];
            afStack_494[1] = auVar29._8_4_ * afStack_494[1];
            afStack_494[2] = auVar29._12_4_ * afStack_494[2];
          }
        }
LAB_003e514a:
        if ((char)local_308 == '\x01') {
          local_308 = local_308 & 0xffffff00;
        }
      }
      if (local_468._0_1_ == true) {
        local_468 = local_468 & 0xffffffffffffff00;
      }
    }
  }
  else {
    this.bits = (uintptr_t)(lightVertices + (long)s + -1);
    auVar58 = ZEXT856(0);
    auVar70 = ZEXT856(0);
    bVar17 = Vertex::IsConnectible((Vertex *)this.bits);
    pVVar2 = local_450;
    local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_);
    uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0);
    uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
    uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
    if (bVar17) {
      pVVar28 = local_450 + (long)t + -1;
      bVar17 = Vertex::IsConnectible(pVVar28);
      local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_);
      uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0);
      uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
      uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
      if (bVar17) {
        SVar74 = Vertex::f((Vertex *)this.bits,pVVar28,Importance);
        auVar63._0_8_ = SVar74.values.values._8_8_;
        auVar63._8_56_ = auVar70;
        auVar39._0_8_ = SVar74.values.values._0_8_;
        auVar39._8_56_ = auVar58;
        auVar29 = vmovlhps_avx(auVar39._0_16_,auVar63._0_16_);
        local_408._0_4_ = auVar29._0_4_ * lightVertices[(long)s + -1].beta.values.values[0];
        local_408._4_4_ = auVar29._4_4_ * lightVertices[(long)s + -1].beta.values.values[1];
        fStack_400 = auVar29._8_4_ * lightVertices[(long)s + -1].beta.values.values[2];
        fStack_3fc = auVar29._12_4_ * lightVertices[(long)s + -1].beta.values.values[3];
        auVar58 = ZEXT856(local_408._8_8_);
        sampler_00.bits = this.bits;
        SVar74 = Vertex::f(pVVar28,(Vertex *)this.bits,Radiance);
        auVar64._0_8_ = SVar74.values.values._8_8_;
        auVar64._8_56_ = auVar70;
        auVar40._0_8_ = SVar74.values.values._0_8_;
        auVar40._8_56_ = auVar58;
        auVar29 = vmovlhps_avx(auVar40._0_16_,auVar64._0_16_);
        local_498 = auVar29._0_4_ * (float)local_408._0_4_ *
                    pVVar2[(long)t + -1].beta.values.values[0];
        afStack_494[0] =
             auVar29._4_4_ * (float)local_408._4_4_ * pVVar2[(long)t + -1].beta.values.values[1];
        afStack_494[1] = auVar29._8_4_ * fStack_400 * pVVar2[(long)t + -1].beta.values.values[2];
        afStack_494[2] = auVar29._12_4_ * fStack_3fc * pVVar2[(long)t + -1].beta.values.values[3];
        auVar58 = ZEXT456(0);
        if ((local_498 == 0.0) && (!NAN(local_498))) {
          uVar22 = 0;
          while (uVar25 = uVar22, uVar25 != 3) {
            if ((afStack_494[uVar25] != 0.0) || (uVar22 = uVar25 + 1, NAN(afStack_494[uVar25])))
            break;
          }
          local_3c8 = (undefined1  [8])CONCAT44(local_3c8._4_4_,local_3c8._0_4_);
          uStack_3c0 = (undefined8 *)CONCAT44(uStack_3c0._4_4_,(Float)uStack_3c0);
          uStack_3b8 = (undefined8 *)CONCAT44(uStack_3b8._4_4_,(Float)uStack_3b8);
          uStack_3b0 = (undefined4 *)CONCAT44(uStack_3b0._4_4_,(Float)uStack_3b0);
          if (2 < uVar25) goto LAB_003e5168;
        }
        auVar70 = (undefined1  [56])0x0;
        SVar74 = G(local_458,(SamplerHandle)sampler_00.bits,(Vertex *)this.bits,pVVar28,local_488);
        auVar65._0_8_ = SVar74.values.values._8_8_;
        auVar65._8_56_ = auVar70;
        auVar41._0_8_ = SVar74.values.values._0_8_;
        auVar41._8_56_ = auVar58;
        auVar29 = vmovlhps_avx(auVar41._0_16_,auVar65._0_16_);
        local_498 = auVar29._0_4_ * local_498;
        afStack_494[0] = auVar29._4_4_ * afStack_494[0];
        afStack_494[1] = auVar29._8_4_ * afStack_494[1];
        afStack_494[2] = auVar29._12_4_ * afStack_494[2];
        goto LAB_003e4314;
      }
    }
  }
LAB_003e5168:
  *(long *)(in_FS_OFFSET + -0x278) = *(long *)(in_FS_OFFSET + -0x278) + 1;
  if ((local_498 == 0.0) && (!NAN(local_498))) {
    uVar22 = 0;
    while (uVar25 = uVar22, uVar25 != 3) {
      if ((afStack_494[uVar25] != 0.0) || (uVar22 = uVar25 + 1, NAN(afStack_494[uVar25]))) break;
    }
    if (2 < uVar25) {
      *(long *)(in_FS_OFFSET + -0x270) = *(long *)(in_FS_OFFSET + -0x270) + 1;
    }
  }
  lVar26 = (long)(s + -2 + t);
  *(long *)(in_FS_OFFSET + -0x268) = *(long *)(in_FS_OFFSET + -0x268) + lVar26;
  *(long *)(in_FS_OFFSET + -0x260) = *(long *)(in_FS_OFFSET + -0x260) + 1;
  lVar23 = *(long *)(in_FS_OFFSET + -0x640);
  if (lVar26 <= *(long *)(in_FS_OFFSET + -0x640)) {
    lVar23 = lVar26;
  }
  *(long *)(in_FS_OFFSET + -0x640) = lVar23;
  if (lVar26 < *(long *)(in_FS_OFFSET + -0x638)) {
    lVar26 = *(long *)(in_FS_OFFSET + -0x638);
  }
  *(long *)(in_FS_OFFSET + -0x638) = lVar26;
  if ((local_498 != 0.0) || (NAN(local_498))) {
LAB_003e5248:
    local_1d0.bits =
         (lightSampler->
         super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
         ).bits;
    fVar34 = MISWeight(local_458,local_410,local_450,&local_1b0,s,t,(LightSamplerHandle *)&local_1d0
                      );
  }
  else {
    uVar22 = 0;
    while (uVar25 = uVar22, uVar25 != 3) {
      if ((afStack_494[uVar25] != 0.0) || (uVar22 = uVar25 + 1, NAN(afStack_494[uVar25]))) break;
    }
    fVar34 = 0.0;
    if (uVar25 < 3) goto LAB_003e5248;
  }
  if (misWeightPtr != (Float *)0x0) {
    *misWeightPtr = fVar34;
  }
  auVar11._4_4_ = fVar34 * afStack_494[0];
  auVar11._0_4_ = fVar34 * local_498;
  auVar11._8_4_ = fVar34 * afStack_494[1];
  auVar11._12_4_ = fVar34 * afStack_494[2];
  auVar29 = *(undefined1 (*) [16])(local_488->pdf).values;
  uVar22 = vcmpps_avx512vl(auVar29,ZEXT816(0) << 0x40,4);
  auVar29 = vdivps_avx512vl(auVar11,auVar29);
  uVar35 = CONCAT44((uint)((byte)(uVar22 >> 1) & 1) * auVar29._4_4_,
                    (uint)((byte)uVar22 & 1) * auVar29._0_4_);
  auVar31._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar29._8_4_;
  auVar31._0_8_ = uVar35;
  auVar31._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar29._12_4_;
  auVar29 = vshufpd_avx(auVar31,auVar31,1);
  uVar59 = auVar29._0_8_;
LAB_003e52c4:
  SVar74.values.values[2] = (float)(int)uVar59;
  SVar74.values.values[3] = (float)(int)((ulong)uVar59 >> 0x20);
  SVar74.values.values[0] = (float)(int)uVar35;
  SVar74.values.values[1] = (float)(int)((ulong)uVar35 >> 0x20);
  return (SampledSpectrum)SVar74.values.values;
}

Assistant:

SampledSpectrum ConnectBDPT(const Integrator &integrator, SampledWavelengths &lambda,
                            Vertex *lightVertices, Vertex *cameraVertices, int s, int t,
                            LightSamplerHandle lightSampler, CameraHandle camera,
                            SamplerHandle sampler, pstd::optional<Point2f> *pRaster,
                            Float *misWeightPtr) {
    SampledSpectrum L(0.f);
    // Ignore invalid connections related to infinite area lights
    if (t > 1 && s != 0 && cameraVertices[t - 1].type == VertexType::Light)
        return SampledSpectrum(0.f);

    // Perform connection and write contribution to _L_
    Vertex sampled;
    if (s == 0) {
        // Interpret the camera subpath as a complete path
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsLight())
            L = pt.Le(integrator.infiniteLights, cameraVertices[t - 2], lambda) * pt.beta;
        DCHECK(!L.HasNaNs());

    } else if (t == 1) {
        // Sample a point on the camera and connect it to the light subpath
        const Vertex &qs = lightVertices[s - 1];
        if (qs.IsConnectible()) {
            pstd::optional<CameraWiSample> cs =
                camera.SampleWi(qs.GetInteraction(), sampler.Get2D(), lambda);
            if (cs) {
                *pRaster = cs->pRaster;
                // Initialize dynamically sampled vertex and _L_ for $t=1$ case
                sampled = Vertex::CreateCamera(camera, cs->pLens, cs->Wi / cs->pdf);
                L = qs.beta * qs.f(sampled, TransportMode::Importance) * sampled.beta;
                if (qs.IsOnSurface())
                    L *= AbsDot(cs->wi, qs.ns());
                DCHECK(!L.HasNaNs());
                if (L) {
                    RNG rng(Hash(cs->pRaster), Hash(cs->pLens));
                    L *= integrator.Tr(cs->pRef, cs->pLens, lambda, rng);
                }
            }
        }

    } else if (s == 1) {
        // Sample a point on a light and connect it to the camera subpath
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsConnectible()) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());

            if (sampledLight) {
                LightHandle light = sampledLight->light;
                Float lightPDF = sampledLight->pdf;

                LightSampleContext ctx;
                if (pt.IsOnSurface()) {
                    const SurfaceInteraction &si = pt.GetInteraction().AsSurface();
                    ctx = LightSampleContext(si);
                    // Try to nudge the light sampling position to correct side of the
                    // surface
                    if (pt.bsdf.HasReflection() && !pt.bsdf.HasTransmission())
                        ctx.pi = si.OffsetRayOrigin(si.wo);
                    else if (pt.bsdf.HasTransmission() && !pt.bsdf.HasReflection())
                        ctx.pi = si.OffsetRayOrigin(-si.wo);
                } else
                    ctx = LightSampleContext(pt.GetInteraction());
                pstd::optional<LightLiSample> lightWeight =
                    light.SampleLi(ctx, sampler.Get2D(), lambda);
                if (lightWeight && lightWeight->L && lightWeight->pdf > 0) {
                    EndpointInteraction ei(light, lightWeight->pLight);
                    sampled = Vertex::CreateLight(
                        ei, lightWeight->L / (lightWeight->pdf * lightPDF), 0);
                    sampled.pdfFwd = sampled.PDFLightOrigin(integrator.infiniteLights, pt,
                                                            lightSampler);
                    L = pt.beta * pt.f(sampled, TransportMode::Radiance) * sampled.beta;
                    if (pt.IsOnSurface())
                        L *= AbsDot(lightWeight->wi, pt.ns());
                    // Only check visibility if the path would carry radiance.
                    if (L) {
                        RNG rng(Hash(ctx.p()), Hash(ctx.n));
                        L *= integrator.Tr(pt.GetInteraction(), lightWeight->pLight,
                                           lambda, rng);
                    }
                }
            }
        }

    } else {
        // Handle all other bidirectional connection cases
        const Vertex &qs = lightVertices[s - 1], &pt = cameraVertices[t - 1];
        if (qs.IsConnectible() && pt.IsConnectible()) {
            L = qs.beta * qs.f(pt, TransportMode::Importance) *
                pt.f(qs, TransportMode::Radiance) * pt.beta;
            PBRT_DBG("%s\n",
                     StringPrintf(
                         "General connect s: %d, t: %d, qs: %s, pt: %s, qs.f(pt): %s, "
                         "pt.f(qs): %s, G: %s, dist^2: %f",
                         s, t, qs, pt, qs.f(pt, TransportMode::Importance),
                         pt.f(qs, TransportMode::Radiance),
                         G(integrator, sampler, qs, pt, lambda),
                         DistanceSquared(qs.p(), pt.p()))
                         .c_str());
            if (L)
                L *= G(integrator, sampler, qs, pt, lambda);
        }
    }

    ++totalPaths;
    if (!L)
        ++zeroRadiancePaths;
    ReportValue(pathLength, s + t - 2);
    // Compute MIS weight for connection strategy
    Float misWeight = L ? MISWeight(integrator, lightVertices, cameraVertices, sampled, s,
                                    t, lightSampler)
                        : 0.f;
    PBRT_DBG("MIS weight for (s,t) = (%d, %d) connection: %f\n", s, t, misWeight);
    DCHECK(!IsNaN(misWeight));
    L *= misWeight;
    if (misWeightPtr != nullptr)
        *misWeightPtr = misWeight;

    return SafeDiv(L, lambda.PDF());
}